

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmm.c
# Opt level: O2

stmm_table * stmm_copy(stmm_table *old_table)

{
  uint uVar1;
  stmm_table_entry *psVar2;
  stmm_compare_func_type p_Var3;
  stmm_hash_func_type p_Var4;
  char *pcVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  stmm_table *__ptr;
  stmm_table_entry **ppsVar10;
  Extra_MmFixed_t *p;
  stmm_table_entry *psVar11;
  ulong uVar12;
  ulong uVar13;
  stmm_table_entry **ppsVar14;
  
  uVar1 = old_table->num_bins;
  __ptr = (stmm_table *)malloc(0x38);
  if (__ptr != (stmm_table *)0x0) {
    __ptr->pMemMan = old_table->pMemMan;
    p_Var3 = old_table->compare;
    p_Var4 = old_table->hash;
    iVar6 = old_table->num_bins;
    iVar7 = old_table->num_entries;
    iVar8 = old_table->max_density;
    iVar9 = old_table->reorder_flag;
    ppsVar10 = old_table->bins;
    __ptr->grow_factor = old_table->grow_factor;
    __ptr->bins = ppsVar10;
    __ptr->num_bins = iVar6;
    __ptr->num_entries = iVar7;
    __ptr->max_density = iVar8;
    __ptr->reorder_flag = iVar9;
    __ptr->compare = p_Var3;
    __ptr->hash = p_Var4;
    ppsVar10 = (stmm_table_entry **)malloc((long)(int)uVar1 * 8);
    __ptr->bins = ppsVar10;
    if (ppsVar10 != (stmm_table_entry **)0x0) {
      p = Extra_MmFixedStart(0x18);
      __ptr->pMemMan = p;
      uVar12 = 0;
      uVar13 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar13 = uVar12;
      }
      do {
        if (uVar12 == uVar13) {
          return __ptr;
        }
        ppsVar10[uVar12] = (stmm_table_entry *)0x0;
        ppsVar14 = old_table->bins + uVar12;
        while (psVar2 = *ppsVar14, psVar2 != (stmm_table_entry *)0x0) {
          psVar11 = (stmm_table_entry *)Extra_MmFixedEntryFetch(p);
          if (psVar11 == (stmm_table_entry *)0x0) {
            Extra_MmFixedStop(p);
            free(ppsVar10);
            goto LAB_003df649;
          }
          psVar11->next = psVar2->next;
          pcVar5 = psVar2->record;
          psVar11->key = psVar2->key;
          psVar11->record = pcVar5;
          psVar11->next = ppsVar10[uVar12];
          ppsVar10[uVar12] = psVar11;
          ppsVar14 = &psVar2->next;
        }
        uVar12 = uVar12 + 1;
      } while( true );
    }
LAB_003df649:
    free(__ptr);
  }
  return (stmm_table *)0x0;
}

Assistant:

stmm_table *
stmm_copy (stmm_table *old_table)
{
    stmm_table *newEntry_table;
    stmm_table_entry *ptr, /* *newEntryptr, *next, */ *newEntry;
    int i, /*j, */ num_bins = old_table->num_bins;

    newEntry_table = ABC_ALLOC(stmm_table, 1);
    if (newEntry_table == NULL) {
    return NULL;
    }

    *newEntry_table = *old_table;
    newEntry_table->bins = ABC_ALLOC(stmm_table_entry *, num_bins);
    if (newEntry_table->bins == NULL) {
    ABC_FREE(newEntry_table);
    return NULL;
    }

    // allocate the memory manager for the newEntry table
    newEntry_table->pMemMan = Extra_MmFixedStart (sizeof (stmm_table_entry));

    for (i = 0; i < num_bins; i++) {
    newEntry_table->bins[i] = NULL;
    ptr = old_table->bins[i];
    while (ptr != NULL) {
//                      newEntry = ABC_ALLOC( stmm_table_entry, 1 );
        newEntry = (stmm_table_entry *)Extra_MmFixedEntryFetch ((Extra_MmFixed_t *)newEntry_table->pMemMan);
        if (newEntry == NULL) {
/*
                for ( j = 0; j <= i; j++ )
                {
                    newEntryptr = newEntry_table->bins[j];
                    while ( newEntryptr != NULL )
                    {
                        next = newEntryptr->next;
                        ABC_FREE( newEntryptr );
                        newEntryptr = next;
                    }
                }
*/
        Extra_MmFixedStop ((Extra_MmFixed_t *)newEntry_table->pMemMan);

        ABC_FREE(newEntry_table->bins);
        ABC_FREE(newEntry_table);
        return NULL;
        }
        *newEntry = *ptr;
        newEntry->next = newEntry_table->bins[i];
        newEntry_table->bins[i] = newEntry;
        ptr = ptr->next;
    }
    }
    return newEntry_table;
}